

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

UColAttributeValue icu_63::CollationRuleParser::getOnOffValue(UnicodeString *s)

{
  ushort uVar1;
  UBool UVar2;
  UColAttributeValue UVar3;
  undefined4 uVar4;
  int iVar5;
  bool bVar6;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78 [3];
  char16_t *local_60;
  UnicodeString local_50;
  
  local_78[0].p_ = L"on";
  UnicodeString::UnicodeString(&local_50,'\x01',local_78,-1);
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar5 = (s->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar1 >> 5;
    }
    uVar4 = local_50.fUnion.fFields.fLength;
    if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
      uVar4 = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    bVar6 = false;
    if ((((int)local_50.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
       (bVar6 = false, iVar5 == uVar4)) {
      UVar2 = UnicodeString::doEquals(s,&local_50,iVar5);
      bVar6 = UVar2 != '\0';
    }
  }
  else {
    bVar6 = (bool)(local_50.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
  }
  UnicodeString::~UnicodeString(&local_50);
  local_60 = local_78[0].p_;
  UVar3 = UCOL_ON;
  if (bVar6 == false) {
    local_80.p_ = L"off";
    UnicodeString::UnicodeString(&local_50,'\x01',&local_80,-1);
    uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar5 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)(short)uVar1 >> 5;
      }
      if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
        local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      bVar6 = false;
      if ((((int)local_50.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
         (iVar5 == local_50.fUnion.fFields.fLength)) {
        UVar2 = UnicodeString::doEquals(s,&local_50,iVar5);
        bVar6 = UVar2 != '\0';
      }
    }
    else {
      bVar6 = (bool)(local_50.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
    }
    UnicodeString::~UnicodeString(&local_50);
    UVar3 = -(uint)(bVar6 == false) | UCOL_OFF;
  }
  return UVar3;
}

Assistant:

UColAttributeValue
CollationRuleParser::getOnOffValue(const UnicodeString &s) {
    if(s == UNICODE_STRING_SIMPLE("on")) {
        return UCOL_ON;
    } else if(s == UNICODE_STRING_SIMPLE("off")) {
        return UCOL_OFF;
    } else {
        return UCOL_DEFAULT;
    }
}